

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::PutEnv(string *env)

{
  int iVar1;
  long lVar2;
  char *__name;
  long lVar3;
  ulong in_RDI;
  string name;
  size_t pos;
  string local_38 [24];
  string *in_stack_ffffffffffffffe0;
  bool local_1;
  
  lVar2 = std::__cxx11::string::find((char)in_RDI,0x3d);
  if (lVar2 == -1) {
    iVar1 = kwsysUnPutEnv(in_stack_ffffffffffffffe0);
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,in_RDI);
    __name = (char *)std::__cxx11::string::c_str();
    lVar3 = std::__cxx11::string::c_str();
    iVar1 = setenv(__name,(char *)(lVar3 + lVar2 + 1),1);
    std::__cxx11::string::~string(local_38);
  }
  local_1 = iVar1 == 0;
  return local_1;
}

Assistant:

bool SystemTools::PutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if (pos != std::string::npos) {
    std::string name = env.substr(0, pos);
    return setenv(name.c_str(), env.c_str() + pos + 1, 1) == 0;
  } else {
    return kwsysUnPutEnv(env) == 0;
  }
}